

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomConnections::read(DomConnections *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  DomConnection *this_00;
  char16_t *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView QVar2;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar2.m_data = L"connection";
        QVar2.m_size = 10;
        __nbytes_00 = L"connection";
        iVar1 = QtPrivate::compareStrings(local_48,QVar2,CaseInsensitive);
        if (iVar1 == 0) {
          this_00 = (DomConnection *)operator_new(0x70);
          *(undefined8 *)this_00 = 0;
          (this_00->m_sender).d.d = (Data *)0x0;
          (this_00->m_sender).d.ptr = (char16_t *)0x0;
          (this_00->m_sender).d.size = 0;
          (this_00->m_signal).d.d = (Data *)0x0;
          (this_00->m_signal).d.ptr = (char16_t *)0x0;
          (this_00->m_signal).d.size = 0;
          (this_00->m_receiver).d.d = (Data *)0x0;
          (this_00->m_receiver).d.ptr = (char16_t *)0x0;
          (this_00->m_receiver).d.size = 0;
          (this_00->m_slot).d.d = (Data *)0x0;
          (this_00->m_slot).d.ptr = (char16_t *)0x0;
          (this_00->m_slot).d.size = 0;
          this_00->m_hints = (DomConnectionHints *)0x0;
          DomConnection::read(this_00,__fd,__buf_00,(size_t)__nbytes_00);
          local_60.d.d = (Data *)this_00;
          QtPrivate::QPodArrayOps<DomConnection*>::emplace<DomConnection*&>
                    ((QPodArrayOps<DomConnection*> *)&this->m_connection,(this->m_connection).d.size
                     ,(DomConnection **)&local_60);
          QList<DomConnection_*>::end(&this->m_connection);
        }
        else {
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_60,&local_78);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          if ((DomConnection *)local_60.d.d != (DomConnection *)0x0) {
            LOCK();
            *(uint *)&(local_60.d.d)->super_QArrayData =
                 *(uint *)&(local_60.d.d)->super_QArrayData - 1;
            UNLOCK();
            if (*(uint *)&(local_60.d.d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else if (iVar1 == 5) break;
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnections::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"connection"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnection();
                v->read(reader);
                m_connection.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}